

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::embedded_test::test_method(embedded_test *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar4;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  string local_c8;
  string local_a8;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined8 local_70;
  CNetAddr addr2;
  CNetAddr addr1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr2,"1.2.3.4",(allocator<char> *)local_88);
  ResolveIP(&addr1,(string *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"::FFFF:0102:0304",(allocator<char> *)&local_a8);
  ResolveIP(&addr2,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x93;
  file.m_begin = (iterator)&local_d8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
  local_a8._M_dataplus._M_p._0_1_ = addr2.m_net == NET_IPV4;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  local_70 = &local_c8;
  local_c8._M_dataplus._M_p = "addr2.IsIPv4()";
  local_c8._M_string_length = 0xbc7ced;
  local_88[8] = false;
  local_88._0_8_ = &PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,(lazy_ostream *)local_88,1,0,WARN,_cVar4,
             (size_t)&local_f8,0x93);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_a8.field_2._M_allocated_capacity);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x94;
  file_00.m_begin = (iterator)&local_108;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
             msg_00);
  local_88[8] = false;
  local_88._0_8_ = &PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_120 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_a8,&addr1);
  CNetAddr::ToStringAddr_abi_cxx11_(&local_c8,&addr2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_88,&local_128,0x94,1,2,&local_a8,"addr1.ToStringAddr()",&local_c8,
             "addr2.ToStringAddr()");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&addr2.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&addr1.m_addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(embedded_test)
{
    CNetAddr addr1(ResolveIP("1.2.3.4"));
    CNetAddr addr2(ResolveIP("::FFFF:0102:0304"));
    BOOST_CHECK(addr2.IsIPv4());
    BOOST_CHECK_EQUAL(addr1.ToStringAddr(), addr2.ToStringAddr());
}